

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

LineInterpolationRange
tcu::(anonymous_namespace)::
calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
          (Vec2 *pa,float wa,Vec2 *pb,float wb,IVec2 *pixel,int subpixelBits,
          _func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
          *weightEquation)

{
  float fVar1;
  int i;
  long lVar2;
  undefined4 in_register_0000000c;
  code *in_R9;
  uint uVar3;
  Vector<float,_2> res_1;
  Vec2 maxWeights;
  Vector<float,_2> res_4;
  Vec2 minWeights;
  LineInterpolationRange *result;
  LineInterpolationRange weights [4];
  Vec2 corners [4];
  float local_c0 [2];
  Vec2 local_b8;
  float local_b0 [2];
  Vec2 local_a8;
  Vec2 *local_a0;
  float local_98 [4];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  local_4c = (float)((int)weightEquation * -0x800000 + 0x40000000);
  local_54 = 0.5 - local_4c * 0.5;
  local_58 = (float)*(int *)CONCAT44(in_register_0000000c,subpixelBits) + local_54;
  local_54 = (float)((int *)CONCAT44(in_register_0000000c,subpixelBits))[1] + local_54;
  local_48 = local_58 + local_4c;
  local_4c = local_4c + local_54;
  local_a0 = pa;
  local_50 = local_58;
  local_44 = local_4c;
  local_40 = local_48;
  local_3c = local_54;
  (*in_R9)(local_98,pb,pixel,&local_58,(int)weightEquation * 0x800000,in_R9,wa);
  (*in_R9)(local_98 + 4,pb,pixel,&local_50);
  (*in_R9)(local_98 + 8,pb,pixel,&local_48);
  (*in_R9)(local_98 + 0xc,pb,pixel,&local_40);
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(local_98[lVar2 + 2] <= local_98[lVar2 + 6]);
    local_b8.m_data[lVar2] =
         (float)(~uVar3 & (uint)local_98[lVar2 + 6] | (uint)local_98[lVar2 + 2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(local_98[lVar2 + 10] <= local_98[lVar2 + 0xe]);
    local_c0[lVar2] =
         (float)(~uVar3 & (uint)local_98[lVar2 + 0xe] | (uint)local_98[lVar2 + 10] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(local_b8.m_data[lVar2] <= local_c0[lVar2]);
    local_a8.m_data[lVar2] =
         (float)(~uVar3 & (uint)local_c0[lVar2] | (uint)local_b8.m_data[lVar2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(local_98[lVar2 + 4] <= local_98[lVar2]);
    local_c0[lVar2] = (float)(~uVar3 & (uint)local_98[lVar2 + 4] | (uint)local_98[lVar2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  lVar2 = 0;
  do {
    uVar3 = -(uint)(local_98[lVar2 + 0xc] <= local_98[lVar2 + 8]);
    local_b0[lVar2] =
         (float)(~uVar3 & (uint)local_98[lVar2 + 0xc] | (uint)local_98[lVar2 + 8] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = local_b0[lVar2];
    uVar3 = -(uint)(fVar1 <= local_c0[lVar2]);
    local_b8.m_data[lVar2] = (float)(~uVar3 & (uint)fVar1 | (uint)local_c0[lVar2] & uVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  *(undefined8 *)local_a0->m_data = 0;
  *(undefined8 *)local_a0[1].m_data = 0;
  *&local_a0[1].m_data = local_a8.m_data;
  *&local_a0->m_data = local_b8.m_data;
  return (LineInterpolationRange)(ZEXT416((uint)fVar1) << 0x40);
}

Assistant:

LineInterpolationRange calcSingleSampleLineInterpolationRangeWithWeightEquation (const tcu::Vec2&	pa,
																				 float				wa,
																				 const tcu::Vec2&	pb,
																				 float				wb,
																				 const tcu::IVec2&	pixel,
																				 int				subpixelBits,
																				 WeightEquation		weightEquation)
{
	// allow interpolation weights anywhere in the central subpixels
	const float testSquareSize = (2.0f / (float)(1UL << subpixelBits));
	const float testSquarePos  = (0.5f - testSquareSize / 2);

	const tcu::Vec2 corners[4] =
	{
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + 0.0f),
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + 0.0f),
	};

	// calculate interpolation as a line
	const LineInterpolationRange weights[4] =
	{
		weightEquation(pa, wa, pb, wb, corners[0]),
		weightEquation(pa, wa, pb, wb, corners[1]),
		weightEquation(pa, wa, pb, wb, corners[2]),
		weightEquation(pa, wa, pb, wb, corners[3]),
	};

	const tcu::Vec2 minWeights = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
	const tcu::Vec2 maxWeights = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));

	LineInterpolationRange result;
	result.min = minWeights;
	result.max = maxWeights;
	return result;
}